

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O3

void __thiscall
VertexAttrib64Bit::GetVertexAttribTest::checkVertexAttribLdv<4u>
          (GetVertexAttribTest *this,GLuint index,bool *result)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  GLenum err;
  ostream *poVar4;
  GLuint i;
  long lVar5;
  int iVar6;
  bool bVar7;
  GLdouble range;
  vertexAttribute<4U> vertex_attribute;
  stringstream function_name;
  long *local_200;
  long local_1f0 [2];
  bool *local_1e0;
  GLdouble local_1d8 [4];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_1e0 = result;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"VertexAttribL",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"dv",2);
  iVar6 = 0;
  while( true ) {
    dVar1 = this->m_min;
    dVar2 = this->m_max;
    lVar5 = 0;
    do {
      uVar3 = (uint)Base::RandomDouble::value;
      bVar7 = 0x1fff < Base::RandomDouble::value;
      Base::RandomDouble::value = Base::RandomDouble::value + 1;
      if (bVar7) {
        Base::RandomDouble::value = 0;
      }
      local_1d8[lVar5] = (double)uVar3 * 0.0001220703125 * (dVar2 - dVar1) + dVar1;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    (*(this->super_Base).gl.vertexAttribL4dv)(index,local_1d8);
    err = (*(this->super_Base).gl.getError)();
    std::__cxx11::stringbuf::str();
    glu::checkError(err,(char *)local_200,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                    ,0x31b);
    if (local_200 != local_1f0) {
      operator_delete(local_200,local_1f0[0] + 1);
    }
    std::__cxx11::stringbuf::str();
    bVar7 = verifyResults(this,local_1d8,4,index,(char *)local_200,0x31d);
    if (local_200 != local_1f0) {
      operator_delete(local_200,local_1f0[0] + 1);
    }
    if (!bVar7) break;
    iVar6 = iVar6 + 1;
    if (iVar6 == 0x80) {
LAB_009fbd27:
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      return;
    }
  }
  *local_1e0 = false;
  goto LAB_009fbd27;
}

Assistant:

void GetVertexAttribTest::checkVertexAttribLdv(GLuint index, bool& result) const
{
	std::stringstream function_name;

	function_name << "VertexAttribL" << SIZE << "dv";

	for (GLuint i = 0; i < m_n_iterations; ++i)
	{
		vertexAttribute<SIZE> vertex_attribute(m_min, m_max);

		vertexAttribLdv<SIZE>(index, vertex_attribute);
		GLU_EXPECT_NO_ERROR(gl.getError(), function_name.str().c_str());

		if (false == verifyResults(vertex_attribute.m_array, SIZE, index, function_name.str().c_str(), __LINE__))
		{
			result = false;
			return;
		}
	}
}